

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteInitCursor(unqlite *pDb,unqlite_kv_cursor **ppOut)

{
  uint uVar1;
  unqlite_kv_methods *puVar2;
  sxu32 nByte;
  int iVar3;
  unqlite_kv_cursor *pSrc;
  
  puVar2 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
  uVar1 = puVar2->szCursor;
  if ((int)uVar1 < 1) {
    unqliteGenErrorFormat(pDb,"Storage engine \'%s\' does not support cursors",puVar2->zName);
    iVar3 = -0x11;
  }
  else {
    nByte = uVar1 | 8;
    if (7 < uVar1) {
      nByte = uVar1;
    }
    pSrc = (unqlite_kv_cursor *)SyMemBackendPoolAlloc(&pDb->sMem,nByte);
    if (pSrc == (unqlite_kv_cursor *)0x0) {
      unqliteGenOutofMem(pDb);
      iVar3 = -1;
    }
    else {
      SyZero(pSrc,nByte);
      pSrc->pStore = ((pDb->sDB).pPager)->pEngine;
      if (puVar2->xCursorInit != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
        (*puVar2->xCursorInit)(pSrc);
      }
      *ppOut = pSrc;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

UNQLITE_PRIVATE int unqliteInitCursor(unqlite *pDb,unqlite_kv_cursor **ppOut)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_cursor *pCur;
	sxu32 nByte;
	/* Storage engine methods */
	pMethods = pDb->sDB.pPager->pEngine->pIo->pMethods;
	if( pMethods->szCursor < 1 ){
		/* Implementation does not supprt cursors */
		unqliteGenErrorFormat(pDb,"Storage engine '%s' does not support cursors",pMethods->zName);
		return UNQLITE_NOTIMPLEMENTED;
	}
	nByte = pMethods->szCursor;
	if( nByte < sizeof(unqlite_kv_cursor) ){
		nByte += sizeof(unqlite_kv_cursor);
	}
	pCur = (unqlite_kv_cursor *)SyMemBackendPoolAlloc(&pDb->sMem,nByte);
	if( pCur == 0 ){
		unqliteGenOutofMem(pDb);
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pCur,nByte);
	/* Save the cursor */
	pCur->pStore = pDb->sDB.pPager->pEngine;
	/* Invoke the initialization callback if any */
	if( pMethods->xCursorInit ){
		pMethods->xCursorInit(pCur);
	}
	/* All done */
	*ppOut = pCur;
	return UNQLITE_OK;
}